

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

void LoadActors(void)

{
  undefined1 local_118 [8];
  FScanner sc;
  cycle_t timer;
  int lump;
  int lastlump;
  
  cycle_t::Reset((cycle_t *)&sc.LastGotLine);
  cycle_t::Clock((cycle_t *)&sc.LastGotLine);
  TArray<FxExpression_*,_FxExpression_*>::Clear
            (&ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>);
  FScriptPosition::ResetErrorCounter();
  InitThingdef();
  timer.Sec._4_4_ = 0;
  while( true ) {
    timer.Sec._0_4_ = FWadCollection::FindLump(&Wads,"DECORATE",(int *)((long)&timer.Sec + 4),false)
    ;
    if (timer.Sec._0_4_ == -1) break;
    FScanner::FScanner((FScanner *)local_118,timer.Sec._0_4_);
    ParseDecorate((FScanner *)local_118);
    FScanner::~FScanner((FScanner *)local_118);
  }
  FinishThingdef();
  if (0 < FScriptPosition::ErrorCounter) {
    I_Error("%d errors while parsing DECORATE scripts",(ulong)(uint)FScriptPosition::ErrorCounter);
  }
  cycle_t::Unclock((cycle_t *)&sc.LastGotLine);
  if ((batchrun & 1U) == 0) {
    cycle_t::TimeMS((cycle_t *)&sc.LastGotLine);
    Printf("DECORATE parsing took %.2f ms\n");
  }
  return;
}

Assistant:

void LoadActors ()
{
	int lastlump, lump;
	cycle_t timer;

	timer.Reset(); timer.Clock();
	ActorDamageFuncs.Clear();
	FScriptPosition::ResetErrorCounter();
	InitThingdef();
	lastlump = 0;
	while ((lump = Wads.FindLump ("DECORATE", &lastlump)) != -1)
	{
		FScanner sc(lump);
		ParseDecorate (sc);
	}
	FinishThingdef();
	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors while parsing DECORATE scripts", FScriptPosition::ErrorCounter);
	}
	timer.Unclock();
	if (!batchrun) Printf("DECORATE parsing took %.2f ms\n", timer.TimeMS());
	// Base time: ~52 ms
}